

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

CURLUcode urlencode_str(dynbuf *o,char *url,size_t len,_Bool relative,_Bool query)

{
  byte bVar1;
  CURLcode CVar2;
  undefined8 in_RAX;
  char *pcVar3;
  byte *pbVar4;
  byte *pbVar5;
  size_t sVar6;
  undefined7 in_register_00000009;
  size_t len_00;
  bool bVar7;
  char *__s;
  undefined8 uStack_38;
  
  pbVar4 = (byte *)url;
  uStack_38 = in_RAX;
  if ((int)CONCAT71(in_register_00000009,relative) == 0) {
    pcVar3 = strstr(url,"//");
    __s = pcVar3 + 2;
    if (pcVar3 == (char *)0x0) {
      __s = url;
    }
    pbVar4 = (byte *)strchr(__s,0x3f);
    pbVar5 = (byte *)strchr(__s,0x2f);
    if (pbVar5 == (byte *)0x0) {
      sVar6 = strlen(url);
      pbVar5 = (byte *)(url + sVar6);
    }
    if (pbVar4 == (byte *)0x0) {
      sVar6 = strlen(url);
      pbVar4 = (byte *)(url + sVar6);
    }
    if (pbVar5 < pbVar4) {
      pbVar4 = pbVar5;
    }
  }
  if (len != 0) {
    bVar7 = !query;
    do {
      if (url < pbVar4) {
LAB_00161fde:
        len_00 = 1;
        pbVar5 = (byte *)url;
      }
      else {
        bVar1 = *url;
        if (bVar1 == 0x3f) {
          bVar7 = false;
          goto LAB_00161fde;
        }
        if (bVar1 == 0x20) {
          if (bVar7) {
            len_00 = 3;
            pbVar5 = (byte *)"%20";
          }
          else {
            len_00 = 1;
            pbVar5 = (byte *)"+";
          }
        }
        else {
          if ((((bVar1 < 0x20) || (bVar1 == 0x20)) || (bVar1 == 0x7f)) || (bVar1 < 0x7f))
          goto LAB_00161fde;
          uStack_38 = CONCAT17("0123456789abcdef"[bVar1 & 0xf],
                               CONCAT16("0123456789abcdef"[bVar1 >> 4],
                                        CONCAT15(0x25,(undefined5)uStack_38)));
          len_00 = 3;
          pbVar5 = (byte *)((long)&uStack_38 + 5);
        }
      }
      CVar2 = Curl_dyn_addn(o,pbVar5,len_00);
      if (CVar2 != CURLE_OK) {
        if (CVar2 != CURLE_TOO_LARGE) {
          return CURLUE_OUT_OF_MEMORY;
        }
        return CURLUE_TOO_LARGE;
      }
      url = (char *)((byte *)url + 1);
      len = len - 1;
    } while (len != 0);
  }
  return CURLUE_OK;
}

Assistant:

static CURLUcode urlencode_str(struct dynbuf *o, const char *url,
                               size_t len, bool relative,
                               bool query)
{
  /* we must add this with whitespace-replacing */
  bool left = !query;
  const unsigned char *iptr;
  const unsigned char *host_sep = (const unsigned char *) url;
  CURLcode result;

  if(!relative)
    host_sep = (const unsigned char *) find_host_sep(url);

  for(iptr = (unsigned char *)url;    /* read from here */
      len; iptr++, len--) {

    if(iptr < host_sep) {
      result = Curl_dyn_addn(o, iptr, 1);
      if(result)
        return cc2cu(result);
      continue;
    }

    if(*iptr == ' ') {
      if(left)
        result = Curl_dyn_addn(o, "%20", 3);
      else
        result = Curl_dyn_addn(o, "+", 1);
      if(result)
        return cc2cu(result);
      continue;
    }

    if(*iptr == '?')
      left = FALSE;

    if(urlchar_needs_escaping(*iptr)) {
      char out[3]={'%'};
      out[1] = hexdigits[*iptr>>4];
      out[2] = hexdigits[*iptr & 0xf];
      result = Curl_dyn_addn(o, out, 3);
    }
    else
      result = Curl_dyn_addn(o, iptr, 1);
    if(result)
      return cc2cu(result);
  }

  return CURLUE_OK;
}